

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_two_connections.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_36f446::TwoConnections::TwoConnections(TwoConnections *this)

{
  shared_ptr<pstore::file::in_memory> *__args;
  __shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TwoConnections_0025ba00;
  pstore::aligned_valloc((pstore *)&this->file,0x800000,0x1000);
  __args = &(this->file).file_;
  std::make_shared<pstore::file::in_memory,std::shared_ptr<unsigned_char>&,unsigned_long_const&>
            ((shared_ptr<unsigned_char> *)__args,(unsigned_long *)&this->file);
  pstore::database::build_new_store
            (&((__args->super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->super_file_base);
  std::__shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             &__args->super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>);
  pstore::database::database<pstore::file::in_memory>
            (&this->first,(shared_ptr<pstore::file::in_memory> *)&local_40,true);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             &__args->super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>);
  pstore::database::database<pstore::file::in_memory>
            (&this->second,(shared_ptr<pstore::file::in_memory> *)&local_40,true);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  (this->first).vacuum_mode_ = disabled;
  (this->second).vacuum_mode_ = disabled;
  return;
}

Assistant:

TwoConnections ()
                : file ()
                , first (file.file ())
                , second (file.file ()) {

            first.set_vacuum_mode (pstore::database::vacuum_mode::disabled);
            second.set_vacuum_mode (pstore::database::vacuum_mode::disabled);
        }